

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool flatbuffers::anon_unknown_0::compareName<flatbuffers::StructDef>(StructDef *a,StructDef *b)

{
  bool bVar1;
  string sStack_58;
  string local_38;
  
  Namespace::GetFullyQualifiedName
            (&sStack_58,(a->super_Definition).defined_namespace,(string *)a,1000);
  Namespace::GetFullyQualifiedName
            (&local_38,(b->super_Definition).defined_namespace,(string *)b,1000);
  bVar1 = std::operator<(&sStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return bVar1;
}

Assistant:

static bool compareName(const T *a, const T *b) {
  return a->defined_namespace->GetFullyQualifiedName(a->name) <
         b->defined_namespace->GetFullyQualifiedName(b->name);
}